

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseName.h
# Opt level: O3

void __thiscall
DatabaseName::DatabaseName
          (DatabaseName *this,path *db_base,string *type,string *id,string *filename)

{
  pointer pcVar1;
  
  std::experimental::filesystem::v1::__cxx11::path::path(&this->db_base,db_base);
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  pcVar1 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type,pcVar1,pcVar1 + type->_M_string_length);
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  pcVar1 = (id->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->id,pcVar1,pcVar1 + id->_M_string_length);
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar1,pcVar1 + filename->_M_string_length);
  return;
}

Assistant:

DatabaseName(fs::path db_base, std::string type, std::string id,
                 std::string filename)
        : db_base(db_base), type(type), id(id), filename(filename) {}